

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundMutation.cpp
# Opt level: O2

void __thiscall CompoundMutation::print(CompoundMutation *this,ostream *os)

{
  pointer psVar1;
  long *plVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  long lVar5;
  
  poVar3 = std::operator<<(os,"HEALTH SHARE ");
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(this->super_MutationComponent).health);
  poVar3 = std::operator<<(poVar3," / 100");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(os,"PRODUCTIVITY SHARE ");
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(this->super_MutationComponent).productivity);
  poVar3 = std::operator<<(poVar3," / 100");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(os,"SIZE SWITCH ");
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(this->super_MutationComponent).size);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(os,"SAFETY SWITCH ");
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(this->super_MutationComponent).safety);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(os,"VELOCITY SWITCH ");
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(this->super_MutationComponent).velocity);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(os,"COVER SWITCH ");
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(this->super_MutationComponent).cover);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(os,"~~~~~~~~~~~~~~~CHILDREN_BEGIN~~~~~~~~~~~~~~~~~~");
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    psVar1 = (this->children).
             super__Vector_base<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->children).
                      super__Vector_base<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar4)
    break;
    plVar2 = *(long **)((long)&(psVar1->
                               super___shared_ptr<MutationComponent,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar5);
    (**(code **)(*plVar2 + 8))(plVar2,os);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  poVar3 = std::operator<<(os,"~~~~~~~~~~~~~~~CHILDREN_END~~~~~~~~~~~~~~~~~~");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void CompoundMutation::print(std::ostream &os) {
  os << "HEALTH SHARE " << health << " / 100" << std::endl;
  os << "PRODUCTIVITY SHARE " << productivity << " / 100" << std::endl;
  os << "SIZE SWITCH " << size << std::endl;
  os << "SAFETY SWITCH " << safety << std::endl;
  os << "VELOCITY SWITCH " << velocity << std::endl;
  os << "COVER SWITCH " << cover << std::endl;
  os << "~~~~~~~~~~~~~~~CHILDREN_BEGIN~~~~~~~~~~~~~~~~~~" << std::endl;
  for (int i = 0; i < children.size(); ++i) {
    children[i]->print(os);
  }
  os << "~~~~~~~~~~~~~~~CHILDREN_END~~~~~~~~~~~~~~~~~~" << std::endl;
}